

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uc.c
# Opt level: O2

uc_err uc_hook_del(uc_engine *uc,uc_hook hh)

{
  _Bool _Var1;
  uc_err uVar2;
  long lVar3;
  int *piVar4;
  
  if ((uc->init_done != false) || (uVar2 = uc_init_engine(uc), uVar2 == UC_ERR_OK)) {
    piVar4 = uc->hooks_count;
    for (lVar3 = 0x328; lVar3 != 0x4d8; lVar3 = lVar3 + 0x18) {
      _Var1 = list_exists((list *)((long)&uc->arch + lVar3),(void *)hh);
      if (_Var1) {
        g_hash_table_foreach(*(GHashTable **)(hh + 0x38),hook_invalidate_region,uc);
        g_hash_table_remove_all(*(GHashTable **)(hh + 0x38));
        *(undefined1 *)(hh + 0x14) = 1;
        *piVar4 = *piVar4 + -1;
        hook_append(&uc->hooks_to_del,(hook *)hh);
      }
      piVar4 = piVar4 + 1;
    }
    uVar2 = UC_ERR_OK;
  }
  return uVar2;
}

Assistant:

UNICORN_EXPORT
uc_err uc_hook_del(uc_engine *uc, uc_hook hh)
{
    int i;
    struct hook *hook = (struct hook *)hh;

    UC_INIT(uc);

    // we can't dereference hook->type if hook is invalid
    // so for now we need to iterate over all possible types to remove the hook
    // which is less efficient
    // an optimization would be to align the hook pointer
    // and store the type mask in the hook pointer.
    for (i = 0; i < UC_HOOK_MAX; i++) {
        if (list_exists(&uc->hook[i], (void *)hook)) {
            g_hash_table_foreach(hook->hooked_regions, hook_invalidate_region,
                                 uc);
            g_hash_table_remove_all(hook->hooked_regions);
            hook->to_delete = true;
            uc->hooks_count[i]--;
            hook_append(&uc->hooks_to_del, hook);
        }
    }

    return UC_ERR_OK;
}